

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersector1<4,_1,_true,_embree::avx2::ArrayIntersector1<embree::avx2::QuadMvIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  long lVar1;
  undefined4 uVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  Geometry *pGVar4;
  RTCIntersectArguments *pRVar5;
  RTCRayQueryContext *pRVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  ulong uVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 (*pauVar34) [16];
  int iVar35;
  uint uVar36;
  uint uVar37;
  long lVar38;
  Scene *pSVar39;
  ulong uVar40;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  undefined4 uVar45;
  ulong unaff_R12;
  ulong uVar46;
  ulong uVar47;
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar74 [32];
  undefined1 auVar73 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  float fVar80;
  float fVar86;
  float fVar87;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  float fVar98;
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  undefined1 auVar101 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [64];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [64];
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  float fVar130;
  float fVar131;
  undefined1 auVar129 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [64];
  undefined1 auVar134 [32];
  undefined1 auVar135 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 (*local_1550) [16];
  int local_151c;
  ulong local_1518;
  RTCFilterFunctionNArguments local_1510;
  undefined1 local_14e0 [32];
  long local_14a8;
  ulong local_14a0;
  ulong local_1498;
  float local_1490;
  float local_148c;
  float local_1488;
  undefined4 local_1484;
  undefined4 local_1480;
  undefined4 local_147c;
  uint local_1478;
  uint local_1474;
  uint local_1470;
  undefined1 local_1460 [32];
  float local_1440;
  float fStack_143c;
  float fStack_1438;
  float fStack_1434;
  float fStack_1430;
  float fStack_142c;
  float fStack_1428;
  float fStack_1424;
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [16];
  undefined1 local_13d0 [16];
  undefined1 local_13c0 [16];
  float local_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  undefined1 local_13a0 [16];
  undefined1 local_1390 [16];
  float local_1380;
  float fStack_137c;
  float fStack_1378;
  float fStack_1374;
  undefined1 local_1370 [16];
  undefined1 local_1360 [16];
  undefined1 local_1350 [16];
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined1 local_1320 [16];
  undefined4 uStack_1310;
  undefined4 uStack_130c;
  undefined4 uStack_1308;
  undefined4 uStack_1304;
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  float local_11e0 [4];
  float fStack_11d0;
  float fStack_11cc;
  float fStack_11c8;
  undefined4 uStack_11c4;
  float local_11c0 [4];
  float fStack_11b0;
  float fStack_11ac;
  float fStack_11a8;
  undefined4 uStack_11a4;
  float local_11a0 [4];
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  undefined4 uStack_1184;
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined4 local_1120;
  undefined4 uStack_111c;
  undefined4 uStack_1118;
  undefined4 uStack_1114;
  undefined4 uStack_1110;
  undefined4 uStack_110c;
  undefined4 uStack_1108;
  undefined4 uStack_1104;
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  long local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  float fVar58;
  float fVar67;
  float fVar68;
  float fVar69;
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_fa0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f98 = 0;
    if (local_fa0 != 8) {
      local_1550 = (undefined1 (*) [16])local_f90;
      aVar3 = (ray->super_RayK<1>).dir.field_0;
      auVar53 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar59 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar81._8_4_ = 0x7fffffff;
      auVar81._0_8_ = 0x7fffffff7fffffff;
      auVar81._12_4_ = 0x7fffffff;
      auVar81 = vandps_avx((undefined1  [16])aVar3,auVar81);
      auVar92._8_4_ = 0x219392ef;
      auVar92._0_8_ = 0x219392ef219392ef;
      auVar92._12_4_ = 0x219392ef;
      auVar81 = vcmpps_avx(auVar81,auVar92,1);
      auVar93._8_4_ = 0x3f800000;
      auVar93._0_8_ = &DAT_3f8000003f800000;
      auVar93._12_4_ = 0x3f800000;
      auVar92 = vdivps_avx(auVar93,(undefined1  [16])aVar3);
      auVar94._8_4_ = 0x5d5e0b6b;
      auVar94._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar94._12_4_ = 0x5d5e0b6b;
      auVar81 = vblendvps_avx(auVar92,auVar94,auVar81);
      auVar82._0_4_ = auVar81._0_4_ * 0.99999964;
      auVar82._4_4_ = auVar81._4_4_ * 0.99999964;
      auVar82._8_4_ = auVar81._8_4_ * 0.99999964;
      auVar82._12_4_ = auVar81._12_4_ * 0.99999964;
      auVar70._0_4_ = auVar81._0_4_ * 1.0000004;
      auVar70._4_4_ = auVar81._4_4_ * 1.0000004;
      auVar70._8_4_ = auVar81._8_4_ * 1.0000004;
      auVar70._12_4_ = auVar81._12_4_ * 1.0000004;
      uVar45 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      local_1350._4_4_ = uVar45;
      local_1350._0_4_ = uVar45;
      local_1350._8_4_ = uVar45;
      local_1350._12_4_ = uVar45;
      auVar108 = ZEXT1664(local_1350);
      uVar45 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      local_1360._4_4_ = uVar45;
      local_1360._0_4_ = uVar45;
      local_1360._8_4_ = uVar45;
      local_1360._12_4_ = uVar45;
      auVar114 = ZEXT1664(local_1360);
      uVar45 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
      local_1370._4_4_ = uVar45;
      local_1370._0_4_ = uVar45;
      local_1370._8_4_ = uVar45;
      local_1370._12_4_ = uVar45;
      auVar119 = ZEXT1664(local_1370);
      auVar81 = vmovshdup_avx(auVar82);
      local_1390 = vshufps_avx(auVar82,auVar82,0x55);
      auVar127 = ZEXT1664(local_1390);
      auVar92 = vshufpd_avx(auVar82,auVar82,1);
      local_13a0 = vshufps_avx(auVar82,auVar82,0xaa);
      auVar128 = ZEXT1664(local_13a0);
      local_13c0 = vshufps_avx(auVar70,auVar70,0x55);
      auVar133 = ZEXT1664(local_13c0);
      uVar44 = (ulong)(auVar82._0_4_ < 0.0) * 0x10;
      uVar42 = (ulong)(auVar81._0_4_ < 0.0) << 4 | 0x20;
      local_13d0 = vshufps_avx(auVar70,auVar70,0xaa);
      auVar135 = ZEXT1664(local_13d0);
      uVar43 = (ulong)(auVar92._0_4_ < 0.0) << 4 | 0x40;
      local_1498 = uVar42 ^ 0x10;
      local_14a0 = uVar43 ^ 0x10;
      uVar45 = auVar53._0_4_;
      local_13e0._4_4_ = uVar45;
      local_13e0._0_4_ = uVar45;
      local_13e0._8_4_ = uVar45;
      local_13e0._12_4_ = uVar45;
      auVar101 = ZEXT1664(local_13e0);
      uVar45 = auVar59._0_4_;
      auVar52 = ZEXT1664(CONCAT412(uVar45,CONCAT48(uVar45,CONCAT44(uVar45,uVar45))));
      local_1140._16_16_ = mm_lookupmask_ps._240_16_;
      local_1140._0_16_ = mm_lookupmask_ps._0_16_;
      auVar74._8_4_ = 0x3f800000;
      auVar74._0_8_ = &DAT_3f8000003f800000;
      auVar74._12_4_ = 0x3f800000;
      auVar74._16_4_ = 0x3f800000;
      auVar74._20_4_ = 0x3f800000;
      auVar74._24_4_ = 0x3f800000;
      auVar74._28_4_ = 0x3f800000;
      auVar50._8_4_ = 0xbf800000;
      auVar50._0_8_ = 0xbf800000bf800000;
      auVar50._12_4_ = 0xbf800000;
      auVar50._16_4_ = 0xbf800000;
      auVar50._20_4_ = 0xbf800000;
      auVar50._24_4_ = 0xbf800000;
      auVar50._28_4_ = 0xbf800000;
      local_1160 = vblendvps_avx(auVar74,auVar50,local_1140);
      local_1380 = auVar82._0_4_;
      fStack_137c = auVar82._0_4_;
      fStack_1378 = auVar82._0_4_;
      fStack_1374 = auVar82._0_4_;
      local_13b0 = auVar70._0_4_;
      fStack_13ac = auVar70._0_4_;
      fStack_13a8 = auVar70._0_4_;
      fStack_13a4 = auVar70._0_4_;
      fVar122 = auVar82._0_4_;
      fVar123 = auVar82._0_4_;
      fVar124 = auVar82._0_4_;
      fVar130 = auVar70._0_4_;
      fVar131 = auVar70._0_4_;
      fVar58 = auVar70._0_4_;
      do {
        do {
          do {
            if (local_1550 == (undefined1 (*) [16])&local_fa0) {
              return;
            }
            pauVar34 = local_1550 + -1;
            local_1550 = local_1550 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)(*pauVar34 + 8));
          uVar47 = *(ulong *)*local_1550;
          do {
            if ((uVar47 & 8) == 0) {
              auVar81 = vsubps_avx(*(undefined1 (*) [16])(uVar47 + 0x20 + uVar44),auVar108._0_16_);
              auVar53._0_4_ = auVar82._0_4_ * auVar81._0_4_;
              auVar53._4_4_ = fVar122 * auVar81._4_4_;
              auVar53._8_4_ = fVar123 * auVar81._8_4_;
              auVar53._12_4_ = fVar124 * auVar81._12_4_;
              auVar81 = vsubps_avx(*(undefined1 (*) [16])(uVar47 + 0x20 + uVar42),auVar114._0_16_);
              auVar59._0_4_ = auVar127._0_4_ * auVar81._0_4_;
              auVar59._4_4_ = auVar127._4_4_ * auVar81._4_4_;
              auVar59._8_4_ = auVar127._8_4_ * auVar81._8_4_;
              auVar59._12_4_ = auVar127._12_4_ * auVar81._12_4_;
              auVar81 = vmaxps_avx(auVar53,auVar59);
              auVar92 = vsubps_avx(*(undefined1 (*) [16])(uVar47 + 0x20 + uVar43),auVar119._0_16_);
              auVar60._0_4_ = auVar128._0_4_ * auVar92._0_4_;
              auVar60._4_4_ = auVar128._4_4_ * auVar92._4_4_;
              auVar60._8_4_ = auVar128._8_4_ * auVar92._8_4_;
              auVar60._12_4_ = auVar128._12_4_ * auVar92._12_4_;
              auVar92 = vmaxps_avx(auVar60,auVar101._0_16_);
              local_1320 = vmaxps_avx(auVar81,auVar92);
              auVar81 = vsubps_avx(*(undefined1 (*) [16])(uVar47 + 0x20 + (uVar44 ^ 0x10)),
                                   auVar108._0_16_);
              auVar61._0_4_ = auVar70._0_4_ * auVar81._0_4_;
              auVar61._4_4_ = fVar130 * auVar81._4_4_;
              auVar61._8_4_ = fVar131 * auVar81._8_4_;
              auVar61._12_4_ = fVar58 * auVar81._12_4_;
              auVar81 = vsubps_avx(*(undefined1 (*) [16])(uVar47 + 0x20 + local_1498),
                                   auVar114._0_16_);
              auVar71._0_4_ = auVar133._0_4_ * auVar81._0_4_;
              auVar71._4_4_ = auVar133._4_4_ * auVar81._4_4_;
              auVar71._8_4_ = auVar133._8_4_ * auVar81._8_4_;
              auVar71._12_4_ = auVar133._12_4_ * auVar81._12_4_;
              auVar81 = vminps_avx(auVar61,auVar71);
              auVar92 = vsubps_avx(*(undefined1 (*) [16])(uVar47 + 0x20 + local_14a0),
                                   auVar119._0_16_);
              auVar72._0_4_ = auVar135._0_4_ * auVar92._0_4_;
              auVar72._4_4_ = auVar135._4_4_ * auVar92._4_4_;
              auVar72._8_4_ = auVar135._8_4_ * auVar92._8_4_;
              auVar72._12_4_ = auVar135._12_4_ * auVar92._12_4_;
              auVar92 = vminps_avx(auVar72,auVar52._0_16_);
              auVar81 = vminps_avx(auVar81,auVar92);
              auVar81 = vcmpps_avx(local_1320,auVar81,2);
              uVar45 = vmovmskps_avx(auVar81);
              unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar45);
            }
            if ((uVar47 & 8) == 0) {
              if (unaff_R12 == 0) {
                iVar35 = 4;
              }
              else {
                uVar46 = uVar47 & 0xfffffffffffffff0;
                lVar41 = 0;
                for (uVar47 = unaff_R12; (uVar47 & 1) == 0;
                    uVar47 = uVar47 >> 1 | 0x8000000000000000) {
                  lVar41 = lVar41 + 1;
                }
                iVar35 = 0;
                uVar40 = unaff_R12 - 1 & unaff_R12;
                uVar47 = *(ulong *)(uVar46 + lVar41 * 8);
                if (uVar40 != 0) {
                  uVar37 = *(uint *)(local_1320 + lVar41 * 4);
                  lVar41 = 0;
                  for (uVar20 = uVar40; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000
                      ) {
                    lVar41 = lVar41 + 1;
                  }
                  uVar40 = uVar40 - 1 & uVar40;
                  uVar20 = *(ulong *)(uVar46 + lVar41 * 8);
                  uVar36 = *(uint *)(local_1320 + lVar41 * 4);
                  if (uVar40 == 0) {
                    if (uVar37 < uVar36) {
                      *(ulong *)*local_1550 = uVar20;
                      *(uint *)(*local_1550 + 8) = uVar36;
                      local_1550 = local_1550 + 1;
                    }
                    else {
                      *(ulong *)*local_1550 = uVar47;
                      *(uint *)(*local_1550 + 8) = uVar37;
                      uVar47 = uVar20;
                      local_1550 = local_1550 + 1;
                    }
                  }
                  else {
                    auVar54._8_8_ = 0;
                    auVar54._0_8_ = uVar47;
                    auVar81 = vpunpcklqdq_avx(auVar54,ZEXT416(uVar37));
                    auVar62._8_8_ = 0;
                    auVar62._0_8_ = uVar20;
                    auVar92 = vpunpcklqdq_avx(auVar62,ZEXT416(uVar36));
                    lVar41 = 0;
                    for (uVar47 = uVar40; (uVar47 & 1) == 0;
                        uVar47 = uVar47 >> 1 | 0x8000000000000000) {
                      lVar41 = lVar41 + 1;
                    }
                    uVar40 = uVar40 - 1 & uVar40;
                    auVar73._8_8_ = 0;
                    auVar73._0_8_ = *(ulong *)(uVar46 + lVar41 * 8);
                    auVar59 = vpunpcklqdq_avx(auVar73,ZEXT416(*(uint *)(local_1320 + lVar41 * 4)));
                    auVar53 = vpcmpgtd_avx(auVar92,auVar81);
                    if (uVar40 == 0) {
                      auVar93 = vpshufd_avx(auVar53,0xaa);
                      auVar53 = vblendvps_avx(auVar92,auVar81,auVar93);
                      auVar81 = vblendvps_avx(auVar81,auVar92,auVar93);
                      auVar92 = vpcmpgtd_avx(auVar59,auVar53);
                      auVar93 = vpshufd_avx(auVar92,0xaa);
                      auVar92 = vblendvps_avx(auVar59,auVar53,auVar93);
                      auVar53 = vblendvps_avx(auVar53,auVar59,auVar93);
                      auVar59 = vpcmpgtd_avx(auVar53,auVar81);
                      auVar93 = vpshufd_avx(auVar59,0xaa);
                      auVar59 = vblendvps_avx(auVar53,auVar81,auVar93);
                      auVar81 = vblendvps_avx(auVar81,auVar53,auVar93);
                      *local_1550 = auVar81;
                      local_1550[1] = auVar59;
                      uVar47 = auVar92._0_8_;
                      local_1550 = local_1550 + 2;
                    }
                    else {
                      lVar41 = 0;
                      for (; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000) {
                        lVar41 = lVar41 + 1;
                      }
                      auVar95._8_8_ = 0;
                      auVar95._0_8_ = *(ulong *)(uVar46 + lVar41 * 8);
                      auVar94 = vpunpcklqdq_avx(auVar95,ZEXT416(*(uint *)(local_1320 + lVar41 * 4)))
                      ;
                      auVar93 = vpshufd_avx(auVar53,0xaa);
                      auVar53 = vblendvps_avx(auVar92,auVar81,auVar93);
                      auVar81 = vblendvps_avx(auVar81,auVar92,auVar93);
                      auVar92 = vpcmpgtd_avx(auVar94,auVar59);
                      auVar93 = vpshufd_avx(auVar92,0xaa);
                      auVar92 = vblendvps_avx(auVar94,auVar59,auVar93);
                      auVar59 = vblendvps_avx(auVar59,auVar94,auVar93);
                      auVar93 = vpcmpgtd_avx(auVar59,auVar81);
                      auVar94 = vpshufd_avx(auVar93,0xaa);
                      auVar93 = vblendvps_avx(auVar59,auVar81,auVar94);
                      auVar81 = vblendvps_avx(auVar81,auVar59,auVar94);
                      auVar59 = vpcmpgtd_avx(auVar92,auVar53);
                      auVar94 = vpshufd_avx(auVar59,0xaa);
                      auVar59 = vblendvps_avx(auVar92,auVar53,auVar94);
                      auVar92 = vblendvps_avx(auVar53,auVar92,auVar94);
                      auVar53 = vpcmpgtd_avx(auVar93,auVar92);
                      auVar94 = vpshufd_avx(auVar53,0xaa);
                      auVar53 = vblendvps_avx(auVar93,auVar92,auVar94);
                      auVar92 = vblendvps_avx(auVar92,auVar93,auVar94);
                      *local_1550 = auVar81;
                      local_1550[1] = auVar92;
                      local_1550[2] = auVar53;
                      auVar101 = ZEXT1664(local_13e0);
                      uVar47 = auVar59._0_8_;
                      local_1550 = local_1550 + 3;
                    }
                  }
                }
              }
            }
            else {
              iVar35 = 6;
            }
          } while (iVar35 == 0);
        } while (iVar35 != 6);
        local_14a8 = (ulong)((uint)uVar47 & 0xf) - 8;
        if (local_14a8 != 0) {
          uVar47 = uVar47 & 0xfffffffffffffff0;
          lVar41 = 0;
          local_1518 = unaff_R12;
          do {
            lVar38 = lVar41 * 0xe0;
            lVar1 = uVar47 + 0xd0 + lVar38;
            local_1340 = *(undefined8 *)(lVar1 + 0x10);
            uStack_1338 = *(undefined8 *)(lVar1 + 0x18);
            lVar1 = uVar47 + 0xc0 + lVar38;
            local_fc0 = *(undefined8 *)(lVar1 + 0x10);
            uStack_fb8 = *(undefined8 *)(lVar1 + 0x18);
            uStack_fb0 = local_fc0;
            uStack_fa8 = uStack_fb8;
            uStack_1330 = local_1340;
            uStack_1328 = uStack_1338;
            auVar48._16_16_ = *(undefined1 (*) [16])(uVar47 + 0x60 + lVar38);
            auVar48._0_16_ = *(undefined1 (*) [16])(uVar47 + lVar38);
            auVar55._16_16_ = *(undefined1 (*) [16])(uVar47 + 0x70 + lVar38);
            auVar55._0_16_ = *(undefined1 (*) [16])(uVar47 + 0x10 + lVar38);
            auVar63._16_16_ = *(undefined1 (*) [16])(uVar47 + 0x80 + lVar38);
            auVar63._0_16_ = *(undefined1 (*) [16])(uVar47 + 0x20 + lVar38);
            auVar81 = *(undefined1 (*) [16])(uVar47 + 0x30 + lVar38);
            auVar75._16_16_ = auVar81;
            auVar75._0_16_ = auVar81;
            auVar81 = *(undefined1 (*) [16])(uVar47 + 0x40 + lVar38);
            auVar83._16_16_ = auVar81;
            auVar83._0_16_ = auVar81;
            auVar81 = *(undefined1 (*) [16])(uVar47 + 0x50 + lVar38);
            auVar96._16_16_ = auVar81;
            auVar96._0_16_ = auVar81;
            auVar81 = *(undefined1 (*) [16])(uVar47 + 0x90 + lVar38);
            auVar99._16_16_ = auVar81;
            auVar99._0_16_ = auVar81;
            auVar81 = *(undefined1 (*) [16])(uVar47 + 0xa0 + lVar38);
            auVar134._16_16_ = auVar81;
            auVar134._0_16_ = auVar81;
            auVar81 = *(undefined1 (*) [16])(uVar47 + 0xb0 + lVar38);
            auVar115._16_16_ = auVar81;
            auVar115._0_16_ = auVar81;
            uVar45 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar120._4_4_ = uVar45;
            auVar120._0_4_ = uVar45;
            auVar120._8_4_ = uVar45;
            auVar120._12_4_ = uVar45;
            auVar120._16_4_ = uVar45;
            auVar120._20_4_ = uVar45;
            auVar120._24_4_ = uVar45;
            auVar120._28_4_ = uVar45;
            uVar45 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar129._4_4_ = uVar45;
            auVar129._0_4_ = uVar45;
            auVar129._8_4_ = uVar45;
            auVar129._12_4_ = uVar45;
            auVar129._16_4_ = uVar45;
            auVar129._20_4_ = uVar45;
            auVar129._24_4_ = uVar45;
            auVar129._28_4_ = uVar45;
            uVar2 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar132._4_4_ = uVar2;
            auVar132._0_4_ = uVar2;
            auVar132._8_4_ = uVar2;
            auVar132._12_4_ = uVar2;
            auVar132._16_4_ = uVar2;
            auVar132._20_4_ = uVar2;
            auVar132._24_4_ = uVar2;
            auVar132._28_4_ = uVar2;
            local_fe0 = vsubps_avx(auVar48,auVar120);
            local_1000 = vsubps_avx(auVar55,auVar129);
            local_1020 = vsubps_avx(auVar63,auVar132);
            auVar50 = vsubps_avx(auVar75,auVar120);
            local_1460 = vsubps_avx(auVar83,auVar129);
            auVar74 = vsubps_avx(auVar96,auVar132);
            auVar66 = vsubps_avx(auVar99,auVar120);
            auVar48 = vsubps_avx(auVar134,auVar129);
            auVar17 = vsubps_avx(auVar115,auVar132);
            local_1040 = vsubps_avx(auVar66,local_fe0);
            local_1080 = vsubps_avx(auVar48,local_1000);
            local_1060 = vsubps_avx(auVar17,local_1020);
            auVar49._0_4_ = auVar66._0_4_ + local_fe0._0_4_;
            auVar49._4_4_ = auVar66._4_4_ + local_fe0._4_4_;
            auVar49._8_4_ = auVar66._8_4_ + local_fe0._8_4_;
            auVar49._12_4_ = auVar66._12_4_ + local_fe0._12_4_;
            auVar49._16_4_ = auVar66._16_4_ + local_fe0._16_4_;
            auVar49._20_4_ = auVar66._20_4_ + local_fe0._20_4_;
            auVar49._24_4_ = auVar66._24_4_ + local_fe0._24_4_;
            auVar49._28_4_ = auVar66._28_4_ + local_fe0._28_4_;
            auVar76._0_4_ = auVar48._0_4_ + local_1000._0_4_;
            auVar76._4_4_ = auVar48._4_4_ + local_1000._4_4_;
            auVar76._8_4_ = auVar48._8_4_ + local_1000._8_4_;
            auVar76._12_4_ = auVar48._12_4_ + local_1000._12_4_;
            auVar76._16_4_ = auVar48._16_4_ + local_1000._16_4_;
            auVar76._20_4_ = auVar48._20_4_ + local_1000._20_4_;
            auVar76._24_4_ = auVar48._24_4_ + local_1000._24_4_;
            auVar76._28_4_ = auVar48._28_4_ + local_1000._28_4_;
            auVar82._0_4_ = local_1020._0_4_;
            auVar84._0_4_ = auVar17._0_4_ + auVar82._0_4_;
            fVar122 = local_1020._4_4_;
            auVar84._4_4_ = auVar17._4_4_ + fVar122;
            fVar123 = local_1020._8_4_;
            auVar84._8_4_ = auVar17._8_4_ + fVar123;
            fVar124 = local_1020._12_4_;
            auVar84._12_4_ = auVar17._12_4_ + fVar124;
            auVar70._0_4_ = local_1020._16_4_;
            auVar84._16_4_ = auVar17._16_4_ + auVar70._0_4_;
            fVar130 = local_1020._20_4_;
            auVar84._20_4_ = auVar17._20_4_ + fVar130;
            fVar131 = local_1020._24_4_;
            auVar84._24_4_ = auVar17._24_4_ + fVar131;
            auVar84._28_4_ = auVar17._28_4_ + local_1020._28_4_;
            auVar18._4_4_ = local_1060._4_4_ * auVar76._4_4_;
            auVar18._0_4_ = local_1060._0_4_ * auVar76._0_4_;
            auVar18._8_4_ = local_1060._8_4_ * auVar76._8_4_;
            auVar18._12_4_ = local_1060._12_4_ * auVar76._12_4_;
            auVar18._16_4_ = local_1060._16_4_ * auVar76._16_4_;
            auVar18._20_4_ = local_1060._20_4_ * auVar76._20_4_;
            auVar18._24_4_ = local_1060._24_4_ * auVar76._24_4_;
            auVar18._28_4_ = uVar45;
            auVar92 = vfmsub231ps_fma(auVar18,local_1080,auVar84);
            auVar19._4_4_ = auVar84._4_4_ * local_1040._4_4_;
            auVar19._0_4_ = auVar84._0_4_ * local_1040._0_4_;
            auVar19._8_4_ = auVar84._8_4_ * local_1040._8_4_;
            auVar19._12_4_ = auVar84._12_4_ * local_1040._12_4_;
            auVar19._16_4_ = auVar84._16_4_ * local_1040._16_4_;
            auVar19._20_4_ = auVar84._20_4_ * local_1040._20_4_;
            auVar19._24_4_ = auVar84._24_4_ * local_1040._24_4_;
            auVar19._28_4_ = auVar84._28_4_;
            auVar53 = vfmsub231ps_fma(auVar19,local_1060,auVar49);
            auVar21._4_4_ = auVar49._4_4_ * local_1080._4_4_;
            auVar21._0_4_ = auVar49._0_4_ * local_1080._0_4_;
            auVar21._8_4_ = auVar49._8_4_ * local_1080._8_4_;
            auVar21._12_4_ = auVar49._12_4_ * local_1080._12_4_;
            auVar21._16_4_ = auVar49._16_4_ * local_1080._16_4_;
            auVar21._20_4_ = auVar49._20_4_ * local_1080._20_4_;
            auVar21._24_4_ = auVar49._24_4_ * local_1080._24_4_;
            auVar21._28_4_ = auVar49._28_4_;
            auVar59 = vfmsub231ps_fma(auVar21,local_1040,auVar76);
            uVar45 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
            local_14e0._4_4_ = uVar45;
            local_14e0._0_4_ = uVar45;
            local_14e0._8_4_ = uVar45;
            local_14e0._12_4_ = uVar45;
            local_14e0._16_4_ = uVar45;
            local_14e0._20_4_ = uVar45;
            local_14e0._24_4_ = uVar45;
            local_14e0._28_4_ = uVar45;
            fStack_143c = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar22._4_4_ = fStack_143c * auVar59._4_4_;
            auVar22._0_4_ = fStack_143c * auVar59._0_4_;
            auVar22._8_4_ = fStack_143c * auVar59._8_4_;
            auVar22._12_4_ = fStack_143c * auVar59._12_4_;
            auVar22._16_4_ = fStack_143c * 0.0;
            auVar22._20_4_ = fStack_143c * 0.0;
            auVar22._24_4_ = fStack_143c * 0.0;
            auVar22._28_4_ = auVar81._12_4_;
            auVar81 = vfmadd231ps_fma(auVar22,local_14e0,ZEXT1632(auVar53));
            uVar45 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
            local_1420._4_4_ = uVar45;
            local_1420._0_4_ = uVar45;
            local_1420._8_4_ = uVar45;
            local_1420._12_4_ = uVar45;
            local_1420._16_4_ = uVar45;
            local_1420._20_4_ = uVar45;
            local_1420._24_4_ = uVar45;
            local_1420._28_4_ = uVar45;
            local_1320 = vfmadd231ps_fma(ZEXT1632(auVar81),local_1420,ZEXT1632(auVar92));
            local_10a0 = vsubps_avx(local_1000,local_1460);
            local_10e0 = vsubps_avx(local_1020,auVar74);
            auVar77._0_4_ = local_1000._0_4_ + local_1460._0_4_;
            auVar77._4_4_ = local_1000._4_4_ + local_1460._4_4_;
            auVar77._8_4_ = local_1000._8_4_ + local_1460._8_4_;
            auVar77._12_4_ = local_1000._12_4_ + local_1460._12_4_;
            auVar77._16_4_ = local_1000._16_4_ + local_1460._16_4_;
            auVar77._20_4_ = local_1000._20_4_ + local_1460._20_4_;
            auVar77._24_4_ = local_1000._24_4_ + local_1460._24_4_;
            auVar77._28_4_ = local_1000._28_4_ + local_1460._28_4_;
            auVar85._0_4_ = auVar74._0_4_ + auVar82._0_4_;
            auVar85._4_4_ = auVar74._4_4_ + fVar122;
            auVar85._8_4_ = auVar74._8_4_ + fVar123;
            auVar85._12_4_ = auVar74._12_4_ + fVar124;
            auVar85._16_4_ = auVar74._16_4_ + auVar70._0_4_;
            auVar85._20_4_ = auVar74._20_4_ + fVar130;
            auVar85._24_4_ = auVar74._24_4_ + fVar131;
            auVar85._28_4_ = auVar74._28_4_ + local_1020._28_4_;
            fVar58 = local_10e0._0_4_;
            fVar69 = local_10e0._4_4_;
            auVar23._4_4_ = auVar77._4_4_ * fVar69;
            auVar23._0_4_ = auVar77._0_4_ * fVar58;
            fVar87 = local_10e0._8_4_;
            auVar23._8_4_ = auVar77._8_4_ * fVar87;
            fVar90 = local_10e0._12_4_;
            auVar23._12_4_ = auVar77._12_4_ * fVar90;
            fVar8 = local_10e0._16_4_;
            auVar23._16_4_ = auVar77._16_4_ * fVar8;
            fVar11 = local_10e0._20_4_;
            auVar23._20_4_ = auVar77._20_4_ * fVar11;
            fVar14 = local_10e0._24_4_;
            auVar23._24_4_ = auVar77._24_4_ * fVar14;
            auVar23._28_4_ = local_1040._28_4_;
            auVar92 = vfmsub231ps_fma(auVar23,local_10a0,auVar85);
            local_10c0 = vsubps_avx(local_fe0,auVar50);
            fVar67 = local_10c0._0_4_;
            fVar80 = local_10c0._4_4_;
            auVar24._4_4_ = auVar85._4_4_ * fVar80;
            auVar24._0_4_ = auVar85._0_4_ * fVar67;
            fVar88 = local_10c0._8_4_;
            auVar24._8_4_ = auVar85._8_4_ * fVar88;
            fVar91 = local_10c0._12_4_;
            auVar24._12_4_ = auVar85._12_4_ * fVar91;
            fVar9 = local_10c0._16_4_;
            auVar24._16_4_ = auVar85._16_4_ * fVar9;
            fVar12 = local_10c0._20_4_;
            auVar24._20_4_ = auVar85._20_4_ * fVar12;
            fVar15 = local_10c0._24_4_;
            auVar24._24_4_ = auVar85._24_4_ * fVar15;
            auVar24._28_4_ = auVar85._28_4_;
            auVar109._0_4_ = local_fe0._0_4_ + auVar50._0_4_;
            auVar109._4_4_ = local_fe0._4_4_ + auVar50._4_4_;
            auVar109._8_4_ = local_fe0._8_4_ + auVar50._8_4_;
            auVar109._12_4_ = local_fe0._12_4_ + auVar50._12_4_;
            auVar109._16_4_ = local_fe0._16_4_ + auVar50._16_4_;
            auVar109._20_4_ = local_fe0._20_4_ + auVar50._20_4_;
            auVar109._24_4_ = local_fe0._24_4_ + auVar50._24_4_;
            auVar109._28_4_ = local_fe0._28_4_ + auVar50._28_4_;
            auVar81 = vfmsub231ps_fma(auVar24,local_10e0,auVar109);
            fVar68 = local_10a0._0_4_;
            fVar86 = local_10a0._4_4_;
            auVar25._4_4_ = auVar109._4_4_ * fVar86;
            auVar25._0_4_ = auVar109._0_4_ * fVar68;
            fVar89 = local_10a0._8_4_;
            auVar25._8_4_ = auVar109._8_4_ * fVar89;
            fVar7 = local_10a0._12_4_;
            auVar25._12_4_ = auVar109._12_4_ * fVar7;
            fVar10 = local_10a0._16_4_;
            auVar25._16_4_ = auVar109._16_4_ * fVar10;
            fVar13 = local_10a0._20_4_;
            auVar25._20_4_ = auVar109._20_4_ * fVar13;
            fVar16 = local_10a0._24_4_;
            auVar25._24_4_ = auVar109._24_4_ * fVar16;
            auVar25._28_4_ = auVar109._28_4_;
            auVar53 = vfmsub231ps_fma(auVar25,local_10c0,auVar77);
            auVar26._4_4_ = fStack_143c * auVar53._4_4_;
            auVar26._0_4_ = fStack_143c * auVar53._0_4_;
            auVar26._8_4_ = fStack_143c * auVar53._8_4_;
            auVar26._12_4_ = fStack_143c * auVar53._12_4_;
            auVar26._16_4_ = fStack_143c * 0.0;
            auVar26._20_4_ = fStack_143c * 0.0;
            auVar26._24_4_ = fStack_143c * 0.0;
            auVar26._28_4_ = auVar77._28_4_;
            auVar81 = vfmadd231ps_fma(auVar26,local_14e0,ZEXT1632(auVar81));
            auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),local_1420,ZEXT1632(auVar92));
            auVar18 = vsubps_avx(auVar50,auVar66);
            auVar64._0_4_ = auVar50._0_4_ + auVar66._0_4_;
            auVar64._4_4_ = auVar50._4_4_ + auVar66._4_4_;
            auVar64._8_4_ = auVar50._8_4_ + auVar66._8_4_;
            auVar64._12_4_ = auVar50._12_4_ + auVar66._12_4_;
            auVar64._16_4_ = auVar50._16_4_ + auVar66._16_4_;
            auVar64._20_4_ = auVar50._20_4_ + auVar66._20_4_;
            auVar64._24_4_ = auVar50._24_4_ + auVar66._24_4_;
            auVar64._28_4_ = auVar50._28_4_ + auVar66._28_4_;
            auVar19 = vsubps_avx(local_1460,auVar48);
            auVar97._0_4_ = local_1460._0_4_ + auVar48._0_4_;
            auVar97._4_4_ = local_1460._4_4_ + auVar48._4_4_;
            auVar97._8_4_ = local_1460._8_4_ + auVar48._8_4_;
            auVar97._12_4_ = local_1460._12_4_ + auVar48._12_4_;
            auVar97._16_4_ = local_1460._16_4_ + auVar48._16_4_;
            auVar97._20_4_ = local_1460._20_4_ + auVar48._20_4_;
            auVar97._24_4_ = local_1460._24_4_ + auVar48._24_4_;
            auVar97._28_4_ = local_1460._28_4_ + auVar48._28_4_;
            auVar48 = vsubps_avx(auVar74,auVar17);
            auVar56._0_4_ = auVar74._0_4_ + auVar17._0_4_;
            auVar56._4_4_ = auVar74._4_4_ + auVar17._4_4_;
            auVar56._8_4_ = auVar74._8_4_ + auVar17._8_4_;
            auVar56._12_4_ = auVar74._12_4_ + auVar17._12_4_;
            auVar56._16_4_ = auVar74._16_4_ + auVar17._16_4_;
            auVar56._20_4_ = auVar74._20_4_ + auVar17._20_4_;
            auVar56._24_4_ = auVar74._24_4_ + auVar17._24_4_;
            auVar56._28_4_ = auVar74._28_4_ + auVar17._28_4_;
            auVar100._0_4_ = auVar48._0_4_ * auVar97._0_4_;
            auVar100._4_4_ = auVar48._4_4_ * auVar97._4_4_;
            auVar100._8_4_ = auVar48._8_4_ * auVar97._8_4_;
            auVar100._12_4_ = auVar48._12_4_ * auVar97._12_4_;
            auVar100._16_4_ = auVar48._16_4_ * auVar97._16_4_;
            auVar100._20_4_ = auVar48._20_4_ * auVar97._20_4_;
            auVar100._24_4_ = auVar48._24_4_ * auVar97._24_4_;
            auVar100._28_4_ = 0;
            auVar53 = vfmsub231ps_fma(auVar100,auVar19,auVar56);
            auVar66._4_4_ = auVar56._4_4_ * auVar18._4_4_;
            auVar66._0_4_ = auVar56._0_4_ * auVar18._0_4_;
            auVar66._8_4_ = auVar56._8_4_ * auVar18._8_4_;
            auVar66._12_4_ = auVar56._12_4_ * auVar18._12_4_;
            auVar66._16_4_ = auVar56._16_4_ * auVar18._16_4_;
            auVar66._20_4_ = auVar56._20_4_ * auVar18._20_4_;
            auVar66._24_4_ = auVar56._24_4_ * auVar18._24_4_;
            auVar66._28_4_ = auVar56._28_4_;
            auVar92 = vfmsub231ps_fma(auVar66,auVar48,auVar64);
            auVar17._4_4_ = auVar19._4_4_ * auVar64._4_4_;
            auVar17._0_4_ = auVar19._0_4_ * auVar64._0_4_;
            auVar17._8_4_ = auVar19._8_4_ * auVar64._8_4_;
            auVar17._12_4_ = auVar19._12_4_ * auVar64._12_4_;
            auVar17._16_4_ = auVar19._16_4_ * auVar64._16_4_;
            auVar17._20_4_ = auVar19._20_4_ * auVar64._20_4_;
            auVar17._24_4_ = auVar19._24_4_ * auVar64._24_4_;
            auVar17._28_4_ = auVar64._28_4_;
            auVar59 = vfmsub231ps_fma(auVar17,auVar18,auVar97);
            local_1440 = fStack_143c;
            fStack_1438 = fStack_143c;
            fStack_1434 = fStack_143c;
            fStack_1430 = fStack_143c;
            fStack_142c = fStack_143c;
            fStack_1428 = fStack_143c;
            fStack_1424 = fStack_143c;
            auVar65._0_4_ = fStack_143c * auVar59._0_4_;
            auVar65._4_4_ = fStack_143c * auVar59._4_4_;
            auVar65._8_4_ = fStack_143c * auVar59._8_4_;
            auVar65._12_4_ = fStack_143c * auVar59._12_4_;
            auVar65._16_4_ = fStack_143c * 0.0;
            auVar65._20_4_ = fStack_143c * 0.0;
            auVar65._24_4_ = fStack_143c * 0.0;
            auVar65._28_4_ = 0;
            auVar92 = vfmadd231ps_fma(auVar65,local_14e0,ZEXT1632(auVar92));
            auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),local_1420,ZEXT1632(auVar53));
            local_12e0 = ZEXT1632(CONCAT412(auVar92._12_4_ + local_1320._12_4_ + auVar81._12_4_,
                                            CONCAT48(auVar92._8_4_ +
                                                     local_1320._8_4_ + auVar81._8_4_,
                                                     CONCAT44(auVar92._4_4_ +
                                                              local_1320._4_4_ + auVar81._4_4_,
                                                              auVar92._0_4_ +
                                                              local_1320._0_4_ + auVar81._0_4_))));
            auVar57._8_4_ = 0x7fffffff;
            auVar57._0_8_ = 0x7fffffff7fffffff;
            auVar57._12_4_ = 0x7fffffff;
            auVar57._16_4_ = 0x7fffffff;
            auVar57._20_4_ = 0x7fffffff;
            auVar57._24_4_ = 0x7fffffff;
            auVar57._28_4_ = 0x7fffffff;
            local_1460 = ZEXT1632(local_1320);
            auVar50 = vminps_avx(local_1460,ZEXT1632(auVar81));
            auVar50 = vminps_avx(auVar50,ZEXT1632(auVar92));
            local_1100 = vandps_avx(local_12e0,auVar57);
            fVar98 = local_1100._0_4_ * 1.1920929e-07;
            fVar102 = local_1100._4_4_ * 1.1920929e-07;
            auVar27._4_4_ = fVar102;
            auVar27._0_4_ = fVar98;
            fVar103 = local_1100._8_4_ * 1.1920929e-07;
            auVar27._8_4_ = fVar103;
            fVar104 = local_1100._12_4_ * 1.1920929e-07;
            auVar27._12_4_ = fVar104;
            fVar105 = local_1100._16_4_ * 1.1920929e-07;
            auVar27._16_4_ = fVar105;
            fVar106 = local_1100._20_4_ * 1.1920929e-07;
            auVar27._20_4_ = fVar106;
            fVar107 = local_1100._24_4_ * 1.1920929e-07;
            auVar27._24_4_ = fVar107;
            auVar27._28_4_ = 0x34000000;
            auVar110._0_8_ = CONCAT44(fVar102,fVar98) ^ 0x8000000080000000;
            auVar110._8_4_ = -fVar103;
            auVar110._12_4_ = -fVar104;
            auVar110._16_4_ = -fVar105;
            auVar110._20_4_ = -fVar106;
            auVar110._24_4_ = -fVar107;
            auVar110._28_4_ = 0xb4000000;
            auVar50 = vcmpps_avx(auVar50,auVar110,5);
            auVar66 = vmaxps_avx(local_1460,ZEXT1632(auVar81));
            auVar74 = vmaxps_avx(auVar66,ZEXT1632(auVar92));
            auVar74 = vcmpps_avx(auVar74,auVar27,2);
            auVar74 = vorps_avx(auVar50,auVar74);
            if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar74 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar74 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar74 >> 0x7f,0) != '\0') ||
                  (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar74 >> 0xbf,0) != '\0') ||
                (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar74[0x1f] < '\0') {
              local_1120 = 0x80000000;
              uStack_111c = 0x80000000;
              uStack_1118 = 0x80000000;
              uStack_1114 = 0x80000000;
              uStack_1110 = 0x80000000;
              uStack_110c = 0x80000000;
              uStack_1108 = 0x80000000;
              uStack_1104 = 0x80000000;
              auVar28._4_4_ = fVar86 * local_1060._4_4_;
              auVar28._0_4_ = fVar68 * local_1060._0_4_;
              auVar28._8_4_ = fVar89 * local_1060._8_4_;
              auVar28._12_4_ = fVar7 * local_1060._12_4_;
              auVar28._16_4_ = fVar10 * local_1060._16_4_;
              auVar28._20_4_ = fVar13 * local_1060._20_4_;
              auVar28._24_4_ = fVar16 * local_1060._24_4_;
              auVar28._28_4_ = auVar50._28_4_;
              auVar29._4_4_ = local_1080._4_4_ * fVar80;
              auVar29._0_4_ = local_1080._0_4_ * fVar67;
              auVar29._8_4_ = local_1080._8_4_ * fVar88;
              auVar29._12_4_ = local_1080._12_4_ * fVar91;
              auVar29._16_4_ = local_1080._16_4_ * fVar9;
              auVar29._20_4_ = local_1080._20_4_ * fVar12;
              auVar29._24_4_ = local_1080._24_4_ * fVar15;
              auVar29._28_4_ = auVar66._28_4_;
              auVar92 = vfmsub213ps_fma(local_1080,local_10e0,auVar28);
              auVar30._4_4_ = fVar69 * auVar19._4_4_;
              auVar30._0_4_ = fVar58 * auVar19._0_4_;
              auVar30._8_4_ = fVar87 * auVar19._8_4_;
              auVar30._12_4_ = fVar90 * auVar19._12_4_;
              auVar30._16_4_ = fVar8 * auVar19._16_4_;
              auVar30._20_4_ = fVar11 * auVar19._20_4_;
              auVar30._24_4_ = fVar14 * auVar19._24_4_;
              auVar30._28_4_ = 0x34000000;
              auVar116._0_4_ = fVar67 * auVar48._0_4_;
              auVar116._4_4_ = fVar80 * auVar48._4_4_;
              auVar116._8_4_ = fVar88 * auVar48._8_4_;
              auVar116._12_4_ = fVar91 * auVar48._12_4_;
              auVar116._16_4_ = fVar9 * auVar48._16_4_;
              auVar116._20_4_ = fVar12 * auVar48._20_4_;
              auVar116._24_4_ = fVar15 * auVar48._24_4_;
              auVar116._28_4_ = 0;
              auVar53 = vfmsub213ps_fma(auVar48,local_10a0,auVar30);
              auVar50 = vandps_avx(auVar28,auVar57);
              auVar66 = vandps_avx(auVar30,auVar57);
              auVar50 = vcmpps_avx(auVar50,auVar66,1);
              local_12c0 = vblendvps_avx(ZEXT1632(auVar53),ZEXT1632(auVar92),auVar50);
              auVar125._0_4_ = fVar68 * auVar18._0_4_;
              auVar125._4_4_ = fVar86 * auVar18._4_4_;
              auVar125._8_4_ = fVar89 * auVar18._8_4_;
              auVar125._12_4_ = fVar7 * auVar18._12_4_;
              auVar125._16_4_ = fVar10 * auVar18._16_4_;
              auVar125._20_4_ = fVar13 * auVar18._20_4_;
              auVar125._24_4_ = fVar16 * auVar18._24_4_;
              auVar125._28_4_ = 0;
              auVar92 = vfmsub213ps_fma(auVar18,local_10e0,auVar116);
              auVar31._4_4_ = local_1040._4_4_ * fVar69;
              auVar31._0_4_ = local_1040._0_4_ * fVar58;
              auVar31._8_4_ = local_1040._8_4_ * fVar87;
              auVar31._12_4_ = local_1040._12_4_ * fVar90;
              auVar31._16_4_ = local_1040._16_4_ * fVar8;
              auVar31._20_4_ = local_1040._20_4_ * fVar11;
              auVar31._24_4_ = local_1040._24_4_ * fVar14;
              auVar31._28_4_ = auVar66._28_4_;
              auVar53 = vfmsub213ps_fma(local_1060,local_10c0,auVar31);
              auVar50 = vandps_avx(auVar31,auVar57);
              auVar66 = vandps_avx(auVar116,auVar57);
              auVar50 = vcmpps_avx(auVar50,auVar66,1);
              local_12a0 = vblendvps_avx(ZEXT1632(auVar92),ZEXT1632(auVar53),auVar50);
              auVar92 = vfmsub213ps_fma(local_1040,local_10a0,auVar29);
              auVar53 = vfmsub213ps_fma(auVar19,local_10c0,auVar125);
              auVar50 = vandps_avx(auVar29,auVar57);
              auVar66 = vandps_avx(auVar125,auVar57);
              auVar50 = vcmpps_avx(auVar50,auVar66,1);
              local_1280 = vblendvps_avx(ZEXT1632(auVar53),ZEXT1632(auVar92),auVar50);
              auVar92 = vpackssdw_avx(auVar74._0_16_,auVar74._16_16_);
              fVar80 = local_1280._0_4_;
              fVar86 = local_1280._4_4_;
              auVar32._4_4_ = fVar86 * fStack_143c;
              auVar32._0_4_ = fVar80 * fStack_143c;
              fVar87 = local_1280._8_4_;
              auVar32._8_4_ = fVar87 * fStack_143c;
              fVar88 = local_1280._12_4_;
              auVar32._12_4_ = fVar88 * fStack_143c;
              fVar89 = local_1280._16_4_;
              auVar32._16_4_ = fVar89 * fStack_143c;
              fVar90 = local_1280._20_4_;
              auVar32._20_4_ = fVar90 * fStack_143c;
              fVar91 = local_1280._24_4_;
              auVar32._24_4_ = fVar91 * fStack_143c;
              auVar32._28_4_ = auVar74._28_4_;
              auVar53 = vfmadd213ps_fma(local_14e0,local_12a0,auVar32);
              auVar53 = vfmadd213ps_fma(local_1420,local_12c0,ZEXT1632(auVar53));
              fVar58 = auVar53._0_4_ + auVar53._0_4_;
              fVar67 = auVar53._4_4_ + auVar53._4_4_;
              fVar68 = auVar53._8_4_ + auVar53._8_4_;
              fVar69 = auVar53._12_4_ + auVar53._12_4_;
              auVar66 = ZEXT1632(CONCAT412(fVar69,CONCAT48(fVar68,CONCAT44(fVar67,fVar58))));
              auVar111._0_4_ = fVar80 * auVar82._0_4_;
              auVar111._4_4_ = fVar86 * fVar122;
              auVar111._8_4_ = fVar87 * fVar123;
              auVar111._12_4_ = fVar88 * fVar124;
              auVar111._16_4_ = fVar89 * auVar70._0_4_;
              auVar111._20_4_ = fVar90 * fVar130;
              auVar111._24_4_ = fVar91 * fVar131;
              auVar111._28_4_ = 0;
              auVar53 = vfmadd213ps_fma(local_1000,local_12a0,auVar111);
              auVar59 = vfmadd213ps_fma(local_fe0,local_12c0,ZEXT1632(auVar53));
              auVar50 = vrcpps_avx(auVar66);
              auVar126._8_4_ = 0x3f800000;
              auVar126._0_8_ = &DAT_3f8000003f800000;
              auVar126._12_4_ = 0x3f800000;
              auVar126._16_4_ = 0x3f800000;
              auVar126._20_4_ = 0x3f800000;
              auVar126._24_4_ = 0x3f800000;
              auVar126._28_4_ = 0x3f800000;
              auVar53 = vfnmadd213ps_fma(auVar50,auVar66,auVar126);
              auVar53 = vfmadd132ps_fma(ZEXT1632(auVar53),auVar50,auVar50);
              local_14e0._28_4_ = 0x3f800000;
              local_14e0._0_28_ =
                   ZEXT1628(CONCAT412((auVar59._12_4_ + auVar59._12_4_) * auVar53._12_4_,
                                      CONCAT48((auVar59._8_4_ + auVar59._8_4_) * auVar53._8_4_,
                                               CONCAT44((auVar59._4_4_ + auVar59._4_4_) *
                                                        auVar53._4_4_,
                                                        (auVar59._0_4_ + auVar59._0_4_) *
                                                        auVar53._0_4_))));
              uVar45 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar112._4_4_ = uVar45;
              auVar112._0_4_ = uVar45;
              auVar112._8_4_ = uVar45;
              auVar112._12_4_ = uVar45;
              auVar112._16_4_ = uVar45;
              auVar112._20_4_ = uVar45;
              auVar112._24_4_ = uVar45;
              auVar112._28_4_ = uVar45;
              auVar50 = vcmpps_avx(auVar112,local_14e0,2);
              auVar82._0_4_ = (ray->super_RayK<1>).tfar;
              auVar117._4_4_ = auVar82._0_4_;
              auVar117._0_4_ = auVar82._0_4_;
              auVar117._8_4_ = auVar82._0_4_;
              auVar117._12_4_ = auVar82._0_4_;
              auVar117._16_4_ = auVar82._0_4_;
              auVar117._20_4_ = auVar82._0_4_;
              auVar117._24_4_ = auVar82._0_4_;
              auVar117._28_4_ = auVar82._0_4_;
              auVar74 = vcmpps_avx(local_14e0,auVar117,2);
              auVar50 = vandps_avx(auVar50,auVar74);
              auVar118._0_8_ = CONCAT44(fVar67,fVar58) ^ 0x8000000080000000;
              auVar118._8_4_ = -fVar68;
              auVar118._12_4_ = -fVar69;
              auVar118._16_4_ = 0x80000000;
              auVar118._20_4_ = 0x80000000;
              auVar118._24_4_ = 0x80000000;
              auVar118._28_4_ = 0x80000000;
              auVar74 = vcmpps_avx(auVar118,auVar66,4);
              auVar50 = vandps_avx(auVar50,auVar74);
              auVar53 = vpackssdw_avx(auVar50._0_16_,auVar50._16_16_);
              auVar92 = vpand_avx(auVar53,auVar92);
              local_1260 = vpmovsxwd_avx2(auVar92);
              if ((((((((local_1260 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (local_1260 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_1260 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_1260 >> 0x7f,0) != '\0') ||
                    (local_1260 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(local_1260 >> 0xbf,0) != '\0') ||
                  (local_1260 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  local_1260[0x1f] < '\0') {
                uStack_1310 = 0;
                uStack_130c = 0;
                uStack_1308 = 0;
                uStack_1304 = 0;
                local_1300 = ZEXT1632(auVar81);
                local_1200 = local_14e0;
                local_1180 = local_1140;
                pSVar39 = context->scene;
                auVar50 = vrcpps_avx(local_12e0);
                local_1400 = local_1260;
                auVar121._8_4_ = 0x3f800000;
                auVar121._0_8_ = &DAT_3f8000003f800000;
                auVar121._12_4_ = 0x3f800000;
                auVar121._16_4_ = 0x3f800000;
                auVar121._20_4_ = 0x3f800000;
                auVar121._24_4_ = 0x3f800000;
                auVar121._28_4_ = 0x3f800000;
                auVar53 = vfnmadd213ps_fma(local_12e0,auVar50,auVar121);
                auVar53 = vfmadd132ps_fma(ZEXT1632(auVar53),auVar50,auVar50);
                auVar113._8_4_ = 0x219392ef;
                auVar113._0_8_ = 0x219392ef219392ef;
                auVar113._12_4_ = 0x219392ef;
                auVar113._16_4_ = 0x219392ef;
                auVar113._20_4_ = 0x219392ef;
                auVar113._24_4_ = 0x219392ef;
                auVar113._28_4_ = 0x219392ef;
                auVar50 = vcmpps_avx(local_1100,auVar113,5);
                auVar50 = vandps_avx(auVar50,ZEXT1632(auVar53));
                auVar33._4_4_ = local_1320._4_4_ * auVar50._4_4_;
                auVar33._0_4_ = local_1320._0_4_ * auVar50._0_4_;
                auVar33._8_4_ = local_1320._8_4_ * auVar50._8_4_;
                auVar33._12_4_ = local_1320._12_4_ * auVar50._12_4_;
                auVar33._16_4_ = auVar50._16_4_ * 0.0;
                auVar33._20_4_ = auVar50._20_4_ * 0.0;
                auVar33._24_4_ = auVar50._24_4_ * 0.0;
                auVar33._28_4_ = 0;
                auVar74 = vminps_avx(auVar33,auVar121);
                auVar78._0_4_ = auVar81._0_4_ * auVar50._0_4_;
                auVar78._4_4_ = auVar81._4_4_ * auVar50._4_4_;
                auVar78._8_4_ = auVar81._8_4_ * auVar50._8_4_;
                auVar78._12_4_ = auVar81._12_4_ * auVar50._12_4_;
                auVar78._16_4_ = auVar50._16_4_ * 0.0;
                auVar78._20_4_ = auVar50._20_4_ * 0.0;
                auVar78._24_4_ = auVar50._24_4_ * 0.0;
                auVar78._28_4_ = 0;
                auVar50 = vminps_avx(auVar78,auVar121);
                auVar66 = vsubps_avx(auVar121,auVar74);
                local_1220 = vblendvps_avx(auVar50,auVar66,local_1140);
                auVar50 = vsubps_avx(auVar121,auVar50);
                local_1240 = vblendvps_avx(auVar74,auVar50,local_1140);
                auVar82._0_4_ = local_1160._0_4_;
                fVar122 = local_1160._4_4_;
                fVar123 = local_1160._8_4_;
                fVar124 = local_1160._12_4_;
                auVar70._0_4_ = local_1160._16_4_;
                fVar130 = local_1160._20_4_;
                fVar131 = local_1160._24_4_;
                local_11e0[0] = local_12c0._0_4_ * auVar82._0_4_;
                local_11e0[1] = local_12c0._4_4_ * fVar122;
                local_11e0[2] = local_12c0._8_4_ * fVar123;
                local_11e0[3] = local_12c0._12_4_ * fVar124;
                fStack_11d0 = local_12c0._16_4_ * auVar70._0_4_;
                fStack_11cc = local_12c0._20_4_ * fVar130;
                fStack_11c8 = local_12c0._24_4_ * fVar131;
                uStack_11c4 = local_1240._28_4_;
                local_11c0[0] = auVar82._0_4_ * local_12a0._0_4_;
                local_11c0[1] = fVar122 * local_12a0._4_4_;
                local_11c0[2] = fVar123 * local_12a0._8_4_;
                local_11c0[3] = fVar124 * local_12a0._12_4_;
                fStack_11b0 = auVar70._0_4_ * local_12a0._16_4_;
                fStack_11ac = fVar130 * local_12a0._20_4_;
                fStack_11a8 = fVar131 * local_12a0._24_4_;
                uStack_11a4 = auVar50._28_4_;
                local_11a0[0] = auVar82._0_4_ * fVar80;
                local_11a0[1] = fVar122 * fVar86;
                local_11a0[2] = fVar123 * fVar87;
                local_11a0[3] = fVar124 * fVar88;
                fStack_1190 = auVar70._0_4_ * fVar89;
                fStack_118c = fVar130 * fVar90;
                fStack_1188 = fVar131 * fVar91;
                uStack_1184 = local_1280._28_4_;
                auVar50 = vpmovzxwd_avx2(auVar92);
                auVar50 = vpslld_avx2(auVar50,0x1f);
                auVar79._8_4_ = 0x7f800000;
                auVar79._0_8_ = 0x7f8000007f800000;
                auVar79._12_4_ = 0x7f800000;
                auVar79._16_4_ = 0x7f800000;
                auVar79._20_4_ = 0x7f800000;
                auVar79._24_4_ = 0x7f800000;
                auVar79._28_4_ = 0x7f800000;
                auVar50 = vblendvps_avx(auVar79,local_14e0,auVar50);
                auVar74 = vshufps_avx(auVar50,auVar50,0xb1);
                auVar74 = vminps_avx(auVar50,auVar74);
                auVar66 = vshufpd_avx(auVar74,auVar74,5);
                auVar74 = vminps_avx(auVar74,auVar66);
                auVar66 = vpermpd_avx2(auVar74,0x4e);
                auVar74 = vminps_avx(auVar74,auVar66);
                auVar50 = vcmpps_avx(auVar50,auVar74,0);
                auVar81 = vpackssdw_avx(auVar50._0_16_,auVar50._16_16_);
                auVar81 = vpand_avx(auVar81,auVar92);
                auVar50 = vpmovzxwd_avx2(auVar81);
                auVar50 = vpslld_avx2(auVar50,0x1f);
                if ((((((((auVar50 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar50 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar50 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar50 >> 0x7f,0) == '\0') &&
                      (auVar50 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar50 >> 0xbf,0) == '\0') &&
                    (auVar50 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar50[0x1f]) {
                  auVar50 = local_1260;
                }
                uVar36 = vmovmskps_avx(auVar50);
                uVar37 = 0;
                for (; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x80000000) {
                  uVar37 = uVar37 + 1;
                }
                do {
                  uVar46 = (ulong)uVar37;
                  uVar37 = *(uint *)((long)&local_fc0 + uVar46 * 4);
                  pGVar4 = (pSVar39->geometries).items[uVar37].ptr;
                  if ((pGVar4->mask & (ray->super_RayK<1>).mask) == 0) {
                    *(undefined4 *)(local_1400 + uVar46 * 4) = 0;
                  }
                  else {
                    pRVar5 = context->args;
                    if ((pRVar5->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      auVar82._0_4_ = *(float *)(local_1240 + uVar46 * 4);
                      fVar122 = *(float *)(local_1220 + uVar46 * 4);
                      (ray->super_RayK<1>).tfar = *(float *)(local_1200 + uVar46 * 4);
                      (ray->Ng).field_0.field_0.x = local_11e0[uVar46];
                      (ray->Ng).field_0.field_0.y = local_11c0[uVar46];
                      (ray->Ng).field_0.field_0.z = local_11a0[uVar46];
                      ray->u = auVar82._0_4_;
                      ray->v = fVar122;
                      ray->primID = *(uint *)((long)&local_1340 + uVar46 * 4);
                      ray->geomID = uVar37;
                      pRVar6 = context->user;
                      ray->instID[0] = pRVar6->instID[0];
                      ray->instPrimID[0] = pRVar6->instPrimID[0];
                      unaff_R12 = local_1518;
                      break;
                    }
                    local_1420._0_8_ = pSVar39;
                    local_1510.context = context->user;
                    local_1490 = local_11e0[uVar46];
                    local_148c = local_11c0[uVar46];
                    local_1488 = local_11a0[uVar46];
                    local_1484 = *(undefined4 *)(local_1240 + uVar46 * 4);
                    local_1480 = *(undefined4 *)(local_1220 + uVar46 * 4);
                    local_147c = *(undefined4 *)((long)&local_1340 + uVar46 * 4);
                    local_1478 = uVar37;
                    local_1474 = (local_1510.context)->instID[0];
                    local_1470 = (local_1510.context)->instPrimID[0];
                    local_1440 = (ray->super_RayK<1>).tfar;
                    (ray->super_RayK<1>).tfar = *(float *)(local_1200 + uVar46 * 4);
                    local_151c = -1;
                    local_1510.valid = &local_151c;
                    local_1510.geometryUserPtr = pGVar4->userPtr;
                    local_1510.ray = (RTCRayN *)ray;
                    local_1510.hit = (RTCHitN *)&local_1490;
                    local_1510.N = 1;
                    if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_019e5df4:
                      if (pRVar5->filter != (RTCFilterFunctionN)0x0) {
                        if (((pRVar5->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((pGVar4->field_8).field_0x2 & 0x40) != 0)) {
                          (*pRVar5->filter)(&local_1510);
                        }
                        if (*local_1510.valid == 0) goto LAB_019e5f0e;
                      }
                      (((Vec3f *)((long)local_1510.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_1510.hit;
                      (((Vec3f *)((long)local_1510.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_1510.hit + 4);
                      (((Vec3f *)((long)local_1510.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_1510.hit + 8);
                      *(float *)((long)local_1510.ray + 0x3c) = *(float *)(local_1510.hit + 0xc);
                      *(float *)((long)local_1510.ray + 0x40) = *(float *)(local_1510.hit + 0x10);
                      *(float *)((long)local_1510.ray + 0x44) = *(float *)(local_1510.hit + 0x14);
                      *(float *)((long)local_1510.ray + 0x48) = *(float *)(local_1510.hit + 0x18);
                      *(float *)((long)local_1510.ray + 0x4c) = *(float *)(local_1510.hit + 0x1c);
                      *(float *)((long)local_1510.ray + 0x50) = *(float *)(local_1510.hit + 0x20);
                    }
                    else {
                      local_1460._0_8_ = lVar41;
                      (*pGVar4->intersectionFilterN)(&local_1510);
                      lVar41 = local_1460._0_8_;
                      if (*local_1510.valid != 0) goto LAB_019e5df4;
LAB_019e5f0e:
                      (ray->super_RayK<1>).tfar = local_1440;
                    }
                    *(undefined4 *)(local_1400 + uVar46 * 4) = 0;
                    auVar82._0_4_ = (ray->super_RayK<1>).tfar;
                    auVar51._4_4_ = auVar82._0_4_;
                    auVar51._0_4_ = auVar82._0_4_;
                    auVar51._8_4_ = auVar82._0_4_;
                    auVar51._12_4_ = auVar82._0_4_;
                    auVar51._16_4_ = auVar82._0_4_;
                    auVar51._20_4_ = auVar82._0_4_;
                    auVar51._24_4_ = auVar82._0_4_;
                    auVar51._28_4_ = auVar82._0_4_;
                    auVar50 = vcmpps_avx(local_14e0,auVar51,2);
                    local_1400 = vandps_avx(auVar50,local_1400);
                    pSVar39 = (Scene *)local_1420._0_8_;
                    unaff_R12 = local_1518;
                  }
                  if ((((((((local_1400 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_1400 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_1400 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_1400 >> 0x7f,0) == '\0') &&
                        (local_1400 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_1400 >> 0xbf,0) == '\0') &&
                      (local_1400 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_1400[0x1f]) break;
                  BVHNIntersector1<4,1,true,embree::avx2::ArrayIntersector1<embree::avx2::QuadMvIntersector1Pluecker<4,true>>>
                  ::intersect(&local_1510);
                  uVar37 = (uint)local_1510.valid;
                } while( true );
              }
            }
            lVar41 = lVar41 + 1;
          } while (lVar41 != local_14a8);
        }
        auVar82._0_4_ = (ray->super_RayK<1>).tfar;
        auVar52 = ZEXT1664(CONCAT412(auVar82._0_4_,
                                     CONCAT48(auVar82._0_4_,CONCAT44(auVar82._0_4_,auVar82._0_4_))))
        ;
        auVar108 = ZEXT1664(local_1350);
        auVar114 = ZEXT1664(local_1360);
        auVar119 = ZEXT1664(local_1370);
        auVar127 = ZEXT1664(local_1390);
        auVar128 = ZEXT1664(local_13a0);
        auVar133 = ZEXT1664(local_13c0);
        auVar135 = ZEXT1664(local_13d0);
        auVar101 = ZEXT1664(local_13e0);
        auVar82._0_4_ = local_1380;
        fVar122 = fStack_137c;
        fVar123 = fStack_1378;
        fVar124 = fStack_1374;
        auVar70._0_4_ = local_13b0;
        fVar130 = fStack_13ac;
        fVar131 = fStack_13a8;
        fVar58 = fStack_13a4;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }